

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.h
# Opt level: O1

int prune_ref_by_selective_ref_frame
              (AV1_COMP *cpi,MACROBLOCK *x,MV_REFERENCE_FRAME *ref_frame,
              uint *ref_display_order_hint)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int i_1;
  int i;
  long lVar6;
  bool bVar7;
  int ref_frame_list [2];
  int local_20 [2];
  
  iVar5 = (cpi->sf).inter_sf.selective_ref_frame;
  if (iVar5 != 0) {
    cVar1 = ref_frame[1];
    if ((1 < iVar5) || (iVar5 == 1 && '\0' < cVar1)) {
      local_20[0] = 3;
      local_20[1] = 2;
      if (x != (MACROBLOCK *)0x0) {
        if ((x->tpl_keep_ref_frame[3] != '\0') || (x->pred_mv_sad[3] == x->best_pred_mv_sad[0])) {
          local_20[0] = -1;
          local_20[1] = 2;
        }
        if ((x->tpl_keep_ref_frame[2] != '\0') || (x->pred_mv_sad[2] == x->best_pred_mv_sad[0])) {
          local_20[1] = 0xffffffff;
        }
      }
      bVar7 = true;
      lVar6 = 0;
      do {
        iVar4 = local_20[lVar6];
        if ((((long)iVar4 != -1) && (iVar4 == cVar1 || iVar4 == *ref_frame)) &&
           ((int)ref_display_order_hint[(long)iVar4 + -1] < (int)ref_display_order_hint[3])) break;
        lVar6 = lVar6 + 1;
        bVar7 = lVar6 == 1;
      } while (bVar7);
      if (bVar7) {
        return 1;
      }
    }
    if (2 < iVar5) {
      local_20[0] = 6;
      local_20[1] = 5;
      if (x != (MACROBLOCK *)0x0) {
        if ((x->tpl_keep_ref_frame[6] != '\0') || (x->pred_mv_sad[6] == x->best_pred_mv_sad[0])) {
          local_20[0] = -1;
          local_20[1] = 5;
        }
        if ((x->tpl_keep_ref_frame[5] != '\0') || (x->pred_mv_sad[5] == x->best_pred_mv_sad[0])) {
          local_20[1] = 0xffffffff;
        }
      }
      bVar7 = true;
      lVar6 = 0;
      do {
        iVar5 = local_20[lVar6];
        if ((((long)iVar5 != -1) && (iVar5 == cVar1 || iVar5 == *ref_frame)) &&
           ((int)ref_display_order_hint[(long)iVar5 + -1] < (int)*ref_display_order_hint)) break;
        lVar6 = lVar6 + 1;
        bVar7 = lVar6 == 1;
      } while (bVar7);
      if (bVar7) {
        return 1;
      }
    }
    if ((x != (MACROBLOCK *)0x0) &&
       (iVar5 = (cpi->sf).inter_sf.prune_comp_ref_frames, iVar5 != 0 && '\0' < cVar1)) {
      cVar2 = (cpi->ref_frame_dist_info).nearest_past_ref;
      cVar3 = (cpi->ref_frame_dist_info).nearest_future_ref;
      if ((*ref_frame != cVar2 && cVar1 != cVar2) || (*ref_frame != cVar3 && cVar1 != cVar3)) {
        if (1 < iVar5) {
          return 1;
        }
        if ((iVar5 == 1) && (iVar5 = has_best_pred_mv_sad(ref_frame,x), iVar5 == 0)) {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static inline int prune_ref_by_selective_ref_frame(
    const AV1_COMP *const cpi, const MACROBLOCK *const x,
    const MV_REFERENCE_FRAME *const ref_frame,
    const unsigned int *const ref_display_order_hint) {
  const SPEED_FEATURES *const sf = &cpi->sf;
  if (!sf->inter_sf.selective_ref_frame) return 0;

  const int comp_pred = ref_frame[1] > INTRA_FRAME;

  if (sf->inter_sf.selective_ref_frame >= 2 ||
      (sf->inter_sf.selective_ref_frame == 1 && comp_pred)) {
    int ref_frame_list[2] = { LAST3_FRAME, LAST2_FRAME };

    if (x != NULL) {
      // Disable pruning if either tpl suggests that we keep the frame or
      // the pred_mv gives us the best sad
      if (x->tpl_keep_ref_frame[LAST3_FRAME] ||
          x->pred_mv_sad[LAST3_FRAME] == x->best_pred_mv_sad[0]) {
        ref_frame_list[0] = NONE_FRAME;
      }
      if (x->tpl_keep_ref_frame[LAST2_FRAME] ||
          x->pred_mv_sad[LAST2_FRAME] == x->best_pred_mv_sad[0]) {
        ref_frame_list[1] = NONE_FRAME;
      }
    }

    if (prune_ref(ref_frame, ref_display_order_hint,
                  ref_display_order_hint[GOLDEN_FRAME - LAST_FRAME],
                  ref_frame_list))
      return 1;
  }

  if (sf->inter_sf.selective_ref_frame >= 3) {
    int ref_frame_list[2] = { ALTREF2_FRAME, BWDREF_FRAME };

    if (x != NULL) {
      // Disable pruning if either tpl suggests that we keep the frame or
      // the pred_mv gives us the best sad
      if (x->tpl_keep_ref_frame[ALTREF2_FRAME] ||
          x->pred_mv_sad[ALTREF2_FRAME] == x->best_pred_mv_sad[0]) {
        ref_frame_list[0] = NONE_FRAME;
      }
      if (x->tpl_keep_ref_frame[BWDREF_FRAME] ||
          x->pred_mv_sad[BWDREF_FRAME] == x->best_pred_mv_sad[0]) {
        ref_frame_list[1] = NONE_FRAME;
      }
    }

    if (prune_ref(ref_frame, ref_display_order_hint,
                  ref_display_order_hint[LAST_FRAME - LAST_FRAME],
                  ref_frame_list))
      return 1;
  }

  if (x != NULL && sf->inter_sf.prune_comp_ref_frames && comp_pred) {
    int closest_ref_frames = has_closest_ref_frames(
        ref_frame, cpi->ref_frame_dist_info.nearest_past_ref,
        cpi->ref_frame_dist_info.nearest_future_ref);
    if (closest_ref_frames == 0) {
      // Prune reference frames which are not the closest to the current frame.
      if (sf->inter_sf.prune_comp_ref_frames >= 2) {
        return 1;
      } else if (sf->inter_sf.prune_comp_ref_frames == 1) {
        // Prune reference frames with non minimum pred_mv_sad.
        if (has_best_pred_mv_sad(ref_frame, x) == 0) return 1;
      }
    }
  }

  return 0;
}